

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

int al_ustr_ncompare(ALLEGRO_USTR *us1,ALLEGRO_USTR *us2,int n)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int pos2;
  int pos1;
  int local_38 [2];
  
  local_38[0] = 0;
  local_38[1] = 0;
  if (0 < n) {
    do {
      iVar2 = al_ustr_get_next(us1,local_38 + 1);
      iVar3 = al_ustr_get_next(us2,local_38);
      if (iVar2 - iVar3 != 0) {
        return iVar2 - iVar3;
      }
    } while ((iVar2 != -1) && (bVar1 = 1 < n, n = n + -1, bVar1));
  }
  return 0;
}

Assistant:

int al_ustr_ncompare(const ALLEGRO_USTR *us1, const ALLEGRO_USTR *us2, int n)
{
   int pos1 = 0;
   int pos2 = 0;

   if (n <= 0)
      return 0;

   for (;;) {
      int32_t c1 = al_ustr_get_next(us1, &pos1);
      int32_t c2 = al_ustr_get_next(us2, &pos2);

      if (c1 != c2) {
         /* This happens to work even when one of c1 or c2 is -1. */
         return c1 - c2;
      }

      if ((c1 == -1) || (--n <= 0))
         return 0;
   }
}